

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.h
# Opt level: O0

void __thiscall
google::protobuf::FieldDescriptorProto::set_type_name(FieldDescriptorProto *this,char *value)

{
  FieldDescriptorProto *this_00;
  string *default_value;
  Arena *arena;
  ArenaStringPtr *in_RSI;
  long in_RDI;
  allocator local_91;
  string local_90 [112];
  ArenaStringPtr *local_20;
  undefined4 local_c;
  uint *local_8;
  
  local_8 = (uint *)(in_RDI + 0x10);
  local_c = 0;
  *local_8 = *local_8 | 4;
  this_00 = (FieldDescriptorProto *)(in_RDI + 0x28);
  local_20 = in_RSI;
  default_value = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,(char *)local_20,&local_91);
  arena = GetArenaNoVirtual(this_00);
  internal::ArenaStringPtr::Set(local_20,default_value,(string *)this_00,arena);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  return;
}

Assistant:

inline void FieldDescriptorProto::set_type_name(const char* value) {
  GOOGLE_DCHECK(value != nullptr);
  _has_bits_[0] |= 0x00000004u;
  type_name_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), ::std::string(value),
              GetArenaNoVirtual());
  // @@protoc_insertion_point(field_set_char:google.protobuf.FieldDescriptorProto.type_name)
}